

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.h
# Opt level: O0

field_element_t field_div(field_t field,field_element_t l,field_element_t r)

{
  field_operation_t res;
  field_element_t r_local;
  field_element_t l_local;
  field_t field_local;
  field_element_t local_1;
  
  if (l == '\0') {
    local_1 = '\0';
  }
  else if (r == '\0') {
    local_1 = '\0';
  }
  else {
    local_1 = field.exp[(ushort)((field.log[l] + 0xff) - (ushort)field.log[r])];
  }
  return local_1;
}

Assistant:

static inline field_element_t field_div(field_t field, field_element_t l, field_element_t r) {
    if (l == 0) {
        return 0;
    }

    if (r == 0) {
        // XXX ???
        return 0;
    }

    // division as subtraction of logarithms

    // if rcoeff is larger, then log[l] - log[r] wraps under
    // so, instead, always add 255. in some cases, we'll wrap over, but
    // that's ok because the exp table runs up to 511.
    field_operation_t res = (field_operation_t)255 + (field_operation_t)field.log[l] - (field_operation_t)field.log[r];
    return field.exp[res];
}